

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterXsYs<unsigned_long_long> *pGVar8;
  TransformerLogLin *pTVar9;
  ImPlotPlot *pIVar10;
  GetterXsYRef<unsigned_long_long> *pGVar11;
  ImDrawVert *pIVar12;
  ImDrawIdx *pIVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [12];
  ImPlotContext *pIVar16;
  ImPlotContext *pIVar17;
  int iVar18;
  long lVar19;
  ImDrawIdx IVar20;
  float fVar21;
  double dVar22;
  double dVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  pIVar16 = GImPlot;
  pGVar8 = this->Getter1;
  pTVar9 = this->Transformer;
  iVar18 = pGVar8->Count;
  lVar19 = (long)(((pGVar8->Offset + prim) % iVar18 + iVar18) % iVar18) * (long)pGVar8->Stride;
  uVar1 = *(unsigned_long_long *)((long)pGVar8->Xs + lVar19);
  uVar2 = *(unsigned_long_long *)((long)pGVar8->Ys + lVar19);
  dVar22 = log10((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar17 = GImPlot;
  pIVar10 = pIVar16->CurrentPlot;
  dVar3 = (pIVar10->XAxis).Range.Min;
  iVar18 = pTVar9->YAxis;
  pGVar11 = this->Getter2;
  pTVar9 = this->Transformer;
  iVar5 = pGVar11->Count;
  uVar1 = *(unsigned_long_long *)
           ((long)pGVar11->Xs +
           (long)(((prim + pGVar11->Offset) % iVar5 + iVar5) % iVar5) * (long)pGVar11->Stride);
  IVar4 = pIVar16->PixelRange[iVar18].Min;
  fVar25 = (float)(pIVar16->My[iVar18] *
                   ((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) -
                   pIVar10->YAxis[iVar18].Range.Min) + (double)IVar4.y);
  fVar26 = (float)(pIVar16->Mx *
                   (((double)(float)(dVar22 / pIVar16->LogDenX) *
                     ((pIVar10->XAxis).Range.Max - dVar3) + dVar3) - dVar3) + (double)IVar4.x);
  dVar3 = pGVar11->YRef;
  dVar23 = log10((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar10 = pIVar17->CurrentPlot;
  dVar22 = (pIVar10->XAxis).Range.Min;
  iVar18 = pTVar9->YAxis;
  IVar4 = pIVar17->PixelRange[iVar18].Min;
  fVar21 = (float)(pIVar17->Mx *
                   (((double)(float)(dVar23 / pIVar17->LogDenX) *
                     ((pIVar10->XAxis).Range.Max - dVar22) + dVar22) - dVar22) + (double)IVar4.x);
  fVar24 = (float)(pIVar17->My[iVar18] * (dVar3 - pIVar10->YAxis[iVar18].Range.Min) +
                  (double)IVar4.y);
  auVar30._0_4_ = ~-(uint)(fVar21 <= fVar26) & (uint)fVar21;
  auVar30._4_4_ = ~-(uint)(fVar24 <= fVar25) & (uint)fVar24;
  auVar30._8_4_ = ~-(uint)(fVar26 < fVar21) & (uint)fVar21;
  auVar30._12_4_ = ~-(uint)(fVar25 < fVar24) & (uint)fVar24;
  auVar14._4_4_ = (uint)fVar25 & -(uint)(fVar24 <= fVar25);
  auVar14._0_4_ = (uint)fVar26 & -(uint)(fVar21 <= fVar26);
  auVar14._8_4_ = (uint)fVar26 & -(uint)(fVar26 < fVar21);
  auVar14._12_4_ = (uint)fVar25 & -(uint)(fVar25 < fVar24);
  auVar30 = auVar30 | auVar14;
  fVar27 = (cull_rect->Min).y;
  auVar15._4_8_ = auVar30._8_8_;
  auVar15._0_4_ = -(uint)(auVar30._4_4_ < fVar27);
  auVar31._0_8_ = auVar15._0_8_ << 0x20;
  auVar31._8_4_ = -(uint)(auVar30._8_4_ < (cull_rect->Max).x);
  auVar31._12_4_ = -(uint)(auVar30._12_4_ < (cull_rect->Max).y);
  auVar32._4_4_ = -(uint)(fVar27 < auVar30._4_4_);
  auVar32._0_4_ = -(uint)((cull_rect->Min).x < auVar30._0_4_);
  auVar32._8_8_ = auVar31._8_8_;
  iVar18 = movmskps((int)cull_rect,auVar32);
  if (iVar18 == 0xf) {
    IVar6 = this->Col;
    IVar4 = *uv;
    fVar27 = fVar21 - fVar26;
    fVar28 = fVar24 - fVar25;
    fVar29 = fVar27 * fVar27 + fVar28 * fVar28;
    if (0.0 < fVar29) {
      fVar29 = 1.0 / SQRT(fVar29);
      fVar27 = fVar27 * fVar29;
      fVar28 = fVar28 * fVar29;
    }
    fVar29 = this->Weight * 0.5;
    pIVar12 = DrawList->_VtxWritePtr;
    fVar27 = fVar29 * fVar27;
    fVar29 = fVar29 * fVar28;
    (pIVar12->pos).x = fVar29 + fVar26;
    (pIVar12->pos).y = fVar25 - fVar27;
    (pIVar12->uv).x = IVar4.x;
    (pIVar12->uv).y = IVar4.y;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar6;
    pIVar12[1].pos.x = fVar29 + fVar21;
    pIVar12[1].pos.y = fVar24 - fVar27;
    pIVar12[1].uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar6;
    pIVar12[2].pos.x = fVar21 - fVar29;
    pIVar12[2].pos.y = fVar24 + fVar27;
    pIVar12[2].uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar6;
    pIVar12[3].pos.x = fVar26 - fVar29;
    pIVar12[3].pos.y = fVar27 + fVar25;
    pIVar12[3].uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    pIVar13 = DrawList->_IdxWritePtr;
    IVar20 = (ImDrawIdx)uVar7;
    *pIVar13 = IVar20;
    pIVar13[1] = IVar20 + 1;
    pIVar13[2] = IVar20 + 2;
    pIVar13[3] = IVar20;
    pIVar13[4] = IVar20 + 2;
    pIVar13[5] = IVar20 + 3;
    DrawList->_IdxWritePtr = pIVar13 + 6;
    DrawList->_VtxCurrentIdx = uVar7 + 4;
  }
  return (char)iVar18 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }